

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2b281f::CAPIBuildEngineDelegate::cycleDetected
          (CAPIBuildEngineDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  pointer ppRVar1;
  pointer ppRVar2;
  vector<llb_data_t_,_std::allocator<llb_data_t_>_> keys;
  vector<llb_data_t_,_std::allocator<llb_data_t_>_> local_58;
  llb_data_t_ local_38;
  
  local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
  super__Vector_impl_data._M_start = (llb_data_t *)0x0;
  local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
  super__Vector_impl_data._M_finish = (llb_data_t_ *)0x0;
  local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (llb_data_t_ *)0x0;
  std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::reserve
            (&local_58,
             (long)(items->
                   super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(items->
                   super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppRVar2 = (items->
            super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppRVar1 = (items->
            super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppRVar2 != ppRVar1) {
    do {
      local_38.length = ((*ppRVar2)->key).key._M_string_length;
      local_38.data = (uint8_t *)((*ppRVar2)->key).key._M_dataplus._M_p;
      if (local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::_M_realloc_insert<llb_data_t_>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        (local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
         super__Vector_impl_data._M_finish)->length = local_38.length;
        (local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
         super__Vector_impl_data._M_finish)->data = local_38.data;
        local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      ppRVar2 = ppRVar2 + 1;
    } while (ppRVar2 != ppRVar1);
  }
  (*(this->cAPIDelegate).cycle_detected)
            ((this->cAPIDelegate).context,
             local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  if (local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
      super__Vector_impl_data._M_start != (llb_data_t *)0x0) {
    operator_delete(local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void cycleDetected(const std::vector<core::Rule*>& items) override {
    std::vector<llb_data_t> keys;
    keys.reserve(items.size());
    for (auto item : items) {
      const KeyType &key = item->key;
      keys.push_back({ key.size(), (const uint8_t*)key.data() });
    }

    cAPIDelegate.cycle_detected(cAPIDelegate.context, keys.data(), keys.size());
  }